

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

pair<bool,_Point> intersection(Segment *segment,Plane *plane)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  pair<bool,_Point> pVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  int local_18;
  undefined8 uStack_14;
  
  uVar7 = (segment->b).x;
  uVar9 = (segment->b).y;
  fVar1 = (segment->a).x;
  fVar2 = (segment->a).y;
  fVar12 = (float)uVar7 - fVar1;
  fVar14 = (float)uVar9 - fVar2;
  fVar3 = (segment->a).z;
  fVar13 = (segment->b).z - fVar3;
  fVar4 = (plane->normal).x;
  fVar5 = (plane->normal).y;
  fVar6 = (plane->normal).z;
  fVar16 = fVar13 * fVar6 + fVar12 * fVar4 + fVar14 * fVar5;
  fVar15 = 0.0;
  if ((((fVar16 == 0.0) && (!NAN(fVar16))) ||
      (fVar16 = -(fVar6 * fVar3 + fVar1 * fVar4 + fVar2 * fVar5 + plane->d) / fVar16, fVar16 < 0.0))
     || (ABS(fVar16) < 1.1920929e-07)) {
    local_18 = (uint)local_18._1_3_ << 8;
    uStack_14 = 0;
  }
  else {
    uVar8 = (segment->a).x;
    uVar10 = (segment->a).y;
    fVar15 = fVar3 + fVar13 * fVar16;
    uStack_14 = CONCAT44((float)uVar10 + fVar14 * fVar16,fVar12 * fVar16 + (float)uVar8);
    local_18 = CONCAT31(local_18._1_3_,1);
  }
  pVar11.second.x = (float)(undefined4)uStack_14;
  pVar11.second.y = (float)uStack_14._4_4_;
  pVar11._0_4_ = local_18;
  pVar11.second.z = fVar15;
  return pVar11;
}

Assistant:

std::pair<bool, Point> intersection(Segment const& segment, Plane const& plane)
{
  Vector V = segment.b - segment.a;
  float x = dotProduct(V, plane.normal);
  if (x == 0)
    return {false, {}};

  float t = -(dotProduct(segment.a, plane.normal) + plane.d) / x;
  if (t < 0 || isCloseToZero(t))
    return {false, {}};

  return {true, segment.a + V * t};
}